

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O0

bool slang::ast::SemanticFacts::isAllowedInModport(SymbolKind kind)

{
  SymbolKind kind_local;
  bool local_1;
  
  if (((kind - Net < 2) || (kind == Subroutine)) || (kind == ClockingBlock)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SemanticFacts::isAllowedInModport(SymbolKind kind) {
    switch (kind) {
        case SymbolKind::Net:
        case SymbolKind::Variable:
        case SymbolKind::Subroutine:
        case SymbolKind::ClockingBlock:
            return true;
        default:
            return false;
    }
}